

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
::_reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
          *this,ID_index cellID,vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary,
          Dimension dim)

{
  size_t *psVar1;
  Column_container *this_00;
  uint uVar2;
  Pos_index PVar3;
  pointer puVar4;
  pointer puVar5;
  iterator __position;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
  *pCVar6;
  long lVar7;
  const_iterator cVar8;
  iterator iVar9;
  _List_node_base *p_Var10;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
  *__k;
  undefined4 uVar11;
  undefined8 *puVar12;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var13;
  __hashtable *__h_1;
  ulong uVar14;
  uint *puVar15;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar16;
  __hashtable *__h;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainsInH;
  Tmp_column column;
  uint local_c4;
  anon_class_24_3_95756d54 local_c0;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_a8;
  uint local_9c;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
  *local_98;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  ulong local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  uVar14 = (ulong)(uint)dim;
  local_9c = cellID;
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_60,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  puVar4 = (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (dim == -1) {
    if (puVar4 == puVar5) {
      uVar14 = 0;
    }
    else {
      uVar14 = (ulong)((int)((ulong)((long)puVar5 - (long)puVar4) >> 2) - 1);
    }
  }
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = (vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__;
  if (puVar4 != puVar5) {
    local_68 = uVar14;
    lVar7 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,*(undefined4 *)(lVar7 + 0x20));
    local_90 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(this + 0x160);
    local_98 = (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
                *)this;
    cVar8 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_90,(key_type *)&local_c0);
    if (cVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        != (__node_type *)0x0) {
      uVar11 = *(undefined4 *)
                ((long)cVar8.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur + 0xc);
      this_00 = &local_98->matrix_;
      while( true ) {
        local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,uVar11);
        iVar9 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_00->_M_h,(key_type *)&local_c0);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
            ._M_cur == (__node_type *)0x0) break;
        if (*(int *)((long)iVar9.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                           ._M_cur + 0x28) == -1) {
          if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) goto LAB_001285d7;
          goto LAB_00128476;
        }
        local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,uVar11);
        iVar9 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_00->_M_h,(key_type *)&local_c0);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
            ._M_cur == (__node_type *)0x0) break;
        for (puVar12 = *(undefined8 **)
                        ((long)iVar9.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                               ._M_cur + 0x40);
            puVar12 !=
            (undefined8 *)
            ((long)iVar9.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                   ._M_cur + 0x40); puVar12 = (undefined8 *)*puVar12) {
          local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,*(undefined4 *)(puVar12 + 2));
          pVar16 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_c0);
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_60,(_Base_ptr)pVar16.first._M_node);
          }
        }
        local_c0.col = (Column *)
                       CONCAT44(local_c0.col._4_4_,
                                *(uint *)((long)iVar9.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                                                ._M_cur + 0x28));
        if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_88,
                     (iterator)
                     local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_c0);
        }
        else {
          *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish =
               *(uint *)((long)iVar9.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                               ._M_cur + 0x28);
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
          local_c4 = local_9c;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_60,&local_c4);
          local_90 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_00128791;
          p_Var13 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          goto LAB_00128730;
        }
        lVar7 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
        local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,*(undefined4 *)(lVar7 + 0x20));
        cVar8 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_90,(key_type *)&local_c0);
        if (cVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) break;
        uVar11 = *(undefined4 *)
                  ((long)cVar8.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                         ._M_cur + 0xc);
      }
    }
LAB_00128847:
    std::__throw_out_of_range("_Map_base::at");
  }
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_60,&local_9c);
  _container_insert<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
            (this,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  &local_60,*(Index *)(this + 0x198),(Dimension)uVar14);
  p_Var10 = (_List_node_base *)operator_new(0x20);
  __k = this + 0x70;
  uVar11 = *(undefined4 *)(this + 0x70);
  *(Dimension *)&p_Var10[1]._M_next = (Dimension)uVar14;
  *(undefined4 *)((long)&p_Var10[1]._M_next + 4) = uVar11;
  *(undefined4 *)&p_Var10[1]._M_prev = 0xffffffff;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  local_c0.col = *(Column **)(this + 0x28);
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(this + 0x38),(const_iterator)0x0,(uint *)__k,
             (_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> *)
             &local_c0);
LAB_00128803:
  *(uint *)__k = *(uint *)__k + 1;
  ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
    *)this)->nextIndex_ =
       ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
         *)this)->nextIndex_ + 1;
LAB_0012880f:
  if ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8;
  while( true ) {
    uVar2 = *(uint *)((long)cVar8.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ._M_cur + 0xc);
    local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,uVar2);
    iVar9 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,(key_type *)&local_c0);
    if (iVar9.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) goto LAB_00128847;
    if (*(int *)((long)iVar9.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                       ._M_cur + 0x28) == -1) {
      local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,uVar2);
      local_c4 = uVar2;
      iVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type *)&local_c0);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_00128847;
      for (puVar12 = *(undefined8 **)
                      ((long)iVar9.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                             ._M_cur + 0x40);
          puVar12 !=
          (undefined8 *)
          ((long)iVar9.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                 ._M_cur + 0x40); puVar12 = (undefined8 *)*puVar12) {
        local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,*(undefined4 *)(puVar12 + 2));
        pVar16 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_c0);
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_60,(_Base_ptr)pVar16.first._M_node);
        }
      }
      __position._M_current = *(uint **)(local_a8 + 8);
      if (__position._M_current == *(uint **)(local_a8 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_a8,__position,&local_c4);
      }
      else {
        *__position._M_current = local_c4;
        *(uint **)(local_a8 + 8) = __position._M_current + 1;
      }
    }
    else {
      local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,uVar2);
      iVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type *)&local_c0);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_00128847;
      for (puVar12 = *(undefined8 **)
                      ((long)iVar9.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                             ._M_cur + 0x40);
          puVar12 !=
          (undefined8 *)
          ((long)iVar9.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                 ._M_cur + 0x40); puVar12 = (undefined8 *)*puVar12) {
        local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,*(undefined4 *)(puVar12 + 2));
        pVar16 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_c0);
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_60,(_Base_ptr)pVar16.first._M_node);
        }
      }
      local_c0.col = (Column *)
                     CONCAT44(local_c0.col._4_4_,
                              *(uint *)((long)iVar9.
                                              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                                              ._M_cur + 0x28));
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_c0);
      }
      else {
        *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish =
             *(uint *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                             ._M_cur + 0x28);
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) break;
LAB_00128476:
    lVar7 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,*(undefined4 *)(lVar7 + 0x20));
    cVar8 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_90,(key_type *)&local_c0);
    if (cVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) goto LAB_00128847;
  }
LAB_001285d7:
  puVar15 = *(undefined4 **)local_a8 + 1;
  if (puVar15 != *(uint **)(local_a8 + 8)) {
    uVar11 = **(undefined4 **)local_a8;
    do {
      local_c4 = *puVar15;
      local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,uVar11);
      iVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type *)&local_c0);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_00128847;
      local_c0.col = (Column *)
                     ((long)iVar9.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                            ._M_cur + 0x10);
      local_c0.this = local_98;
      local_c0.sourceColumnIndex = &local_c4;
      _add_to<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>::add_to(unsigned_int,unsigned_int)::_lambda()_1_>
                ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
                  *)local_98,local_c0.col,&local_c0);
      puVar15 = puVar15 + 1;
    } while (puVar15 != *(uint **)(local_a8 + 8));
  }
  local_c4 = local_9c;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_60,&local_c4);
  local_90 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    p_Var13 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
    do {
      local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,*(undefined4 *)&p_Var13->_M_buckets);
      iVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type *)&local_c0);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_00128847;
      for (puVar12 = *(undefined8 **)
                      ((long)iVar9.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                             ._M_cur + 0x40);
          puVar12 !=
          (undefined8 *)
          ((long)iVar9.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                 ._M_cur + 0x40); puVar12 = (undefined8 *)*puVar12) {
        local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,*(undefined4 *)(puVar12 + 2));
        pVar16 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_c0);
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_60,(_Base_ptr)pVar16.first._M_node);
        }
      }
      p_Var13 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)((long)&p_Var13->_M_buckets + 4);
    } while (p_Var13 != local_90);
  }
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
  ::_insert_chain(local_98,(Tmp_column *)&local_60,(Dimension)local_68,**(Index **)local_a8);
  goto LAB_0012880f;
  while( true ) {
    for (puVar12 = *(undefined8 **)
                    ((long)iVar9.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
                           ._M_cur + 0x40);
        puVar12 !=
        (undefined8 *)
        ((long)iVar9.
               super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
               ._M_cur + 0x40); puVar12 = (undefined8 *)*puVar12) {
      local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,*(undefined4 *)(puVar12 + 2));
      pVar16 = std::
               _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_c0);
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)&local_60,(_Base_ptr)pVar16.first._M_node);
      }
    }
    p_Var13 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)((long)&p_Var13->_M_buckets + 4);
    if (p_Var13 == local_90) break;
LAB_00128730:
    local_c0.col = (Column *)CONCAT44(local_c0.col._4_4_,*(undefined4 *)&p_Var13->_M_buckets);
    iVar9 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,(key_type *)&local_c0);
    if (iVar9.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) goto LAB_00128847;
  }
LAB_00128791:
  _container_insert<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
              *)local_98,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_60,
             local_98->nextIndex_,(Dimension)local_68);
  p_Var10 = (_List_node_base *)operator_new(0x20);
  pCVar6 = local_98;
  __k = (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
         *)&(local_98->super_Chain_vine_swap_option).super_type.
            super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
            .nextPosition_;
  PVar3 = (local_98->super_Chain_vine_swap_option).super_type.
          super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
          .nextPosition_;
  *(int *)&p_Var10[1]._M_next = (int)local_68;
  *(Pos_index *)((long)&p_Var10[1]._M_next + 4) = PVar3;
  *(undefined4 *)&p_Var10[1]._M_prev = 0xffffffff;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  psVar1 = (size_t *)
           ((long)&(pCVar6->super_Chain_vine_swap_option).super_type.
                   super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
                   .barcode_.
                   super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar1 = *psVar1 + 1;
  local_c0.col = *(Column **)
                  ((long)&(pCVar6->super_Chain_vine_swap_option).super_type.
                          super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
                          .barcode_.
                          super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                          ._M_impl._M_node + 8);
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&(pCVar6->super_Chain_vine_swap_option).super_type.
                 super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
                 .indexToBar_,(const_iterator)0x0,(uint *)__k,
             (_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> *)
             &local_c0);
  this = (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
          *)local_98;
  goto LAB_00128803;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}